

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9CompileBlock(jx9_gen_state *pGen)

{
  sxu32 nLine;
  sxi32 sVar1;
  sxi32 sVar2;
  SyToken *pSVar3;
  GenBlock **ppBlock;
  
  if ((pGen->pIn->nType & 0x40) == 0) {
    sVar1 = GenStateCompileChunk(pGen,1);
    if (sVar1 == -10) {
      sVar1 = -10;
    }
    else {
LAB_0012435a:
      pSVar3 = pGen->pIn;
      sVar1 = 0;
      while ((pSVar3 < pGen->pEnd && ((pSVar3->nType & 0x40000) != 0))) {
        pSVar3 = pSVar3 + 1;
        pGen->pIn = pSVar3;
      }
    }
  }
  else {
    nLine = pGen->pIn->nLine;
    ppBlock = (GenBlock **)0x80;
    sVar2 = GenStateEnterBlock(pGen,0x80,pGen->pVm->pByteContainer->nUsed,(void *)0x0,
                               (GenBlock **)0x0);
    sVar1 = -10;
    if (sVar2 == 0) {
      pGen->pIn = pGen->pIn + 1;
      do {
        pSVar3 = pGen->pIn;
        if (pGen->pEnd <= pSVar3) {
          ppBlock = (GenBlock **)0x1;
          jx9GenCompileError(pGen,1,nLine,"Missing closing braces \'}\'");
LAB_00124352:
          GenStateLeaveBlock(pGen,ppBlock);
          goto LAB_0012435a;
        }
        if ((pSVar3->nType & 0x80) != 0) {
          pGen->pIn = pSVar3 + 1;
          goto LAB_00124352;
        }
        ppBlock = (GenBlock **)0x1;
        sVar2 = GenStateCompileChunk(pGen,1);
      } while (sVar2 != -10);
    }
  }
  return sVar1;
}

Assistant:

static sxi32 jx9CompileBlock(
	jx9_gen_state *pGen /* Code generator state */
	)
{
	sxi32 rc;
	if( pGen->pIn->nType & JX9_TK_OCB /* '{' */ ){
		sxu32 nLine = pGen->pIn->nLine;
		rc = GenStateEnterBlock(&(*pGen), GEN_BLOCK_STD, jx9VmInstrLength(pGen->pVm), 0, 0);
		if( rc != SXRET_OK ){
			return SXERR_ABORT;
		}
		pGen->pIn++;
		/* Compile until we hit the closing braces '}' */
		for(;;){
			if( pGen->pIn >= pGen->pEnd ){
				/* No more token to process. Missing closing braces */
				jx9GenCompileError(&(*pGen), E_ERROR, nLine, "Missing closing braces '}'");
				break;
			}
			if( pGen->pIn->nType & JX9_TK_CCB/*'}'*/ ){
				/* Closing braces found, break immediately*/
				pGen->pIn++;
				break;
			}
			/* Compile a single statement */
			rc = GenStateCompileChunk(&(*pGen),JX9_COMPILE_SINGLE_STMT);
			if( rc == SXERR_ABORT ){
				return SXERR_ABORT;
			}
		}
		GenStateLeaveBlock(&(*pGen), 0);			
	}else{
		/* Compile a single statement */
		rc = GenStateCompileChunk(&(*pGen),JX9_COMPILE_SINGLE_STMT);
		if( rc == SXERR_ABORT ){
			return SXERR_ABORT;
		}
	}
	/* Jump trailing semi-colons ';' */
	while( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & JX9_TK_SEMI) ){
		pGen->pIn++;
	}
	return SXRET_OK;
}